

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

int use_pole(obj *obj)

{
  char cVar1;
  uint uVar2;
  monst *pmVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  monst *pmVar7;
  int iVar8;
  char *line;
  coord cc;
  coord local_2a;
  
  if ((u._1052_1_ & 1) != 0) {
    pline("There\'s not enough room here to use that.");
    return 0;
  }
  iVar8 = 0;
  if (uwep != obj) {
    bVar4 = wield_tool(obj,"swing");
    iVar8 = 1;
    if (bVar4 == '\0') {
      return 0;
    }
  }
  pline("Where do you want to hit?");
  local_2a.x = u.ux;
  local_2a.y = u.uy;
  iVar5 = getpos(&local_2a,'\0',"the spot to hit");
  if (iVar5 < 0) {
    return 0;
  }
  iVar5 = uwep_skill_type();
  iVar6 = 4;
  if ((iVar5 != 0) && (cVar1 = u.weapon_skills[iVar5].skill, '\x02' < cVar1)) {
    iVar6 = (uint)(cVar1 != '\x03') + (uint)(cVar1 != '\x03') * 2 + 5;
  }
  iVar5 = dist2((int)local_2a.x,(int)local_2a.y,(int)u.ux,(int)u.uy);
  if (iVar6 < iVar5) {
    line = "Too far!";
    goto LAB_00149403;
  }
  iVar5 = dist2((int)local_2a.x,(int)local_2a.y,(int)u.ux,(int)u.uy);
  if (iVar5 < 4) {
    line = "Too close!";
    goto LAB_00149403;
  }
  if ((viz_array[local_2a.y][local_2a.x] & 2U) == 0) {
    pmVar3 = level->monsters[local_2a.x][local_2a.y];
    pmVar7 = (monst *)0x0;
    if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
      pmVar7 = pmVar3;
    }
    if (pmVar7 != (monst *)0x0) {
      if (pmVar7->wormno == '\0') {
        if (((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
             ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
              (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
            (((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0 &&
             ((pmVar7->data->mflags3 & 0x200) != 0)))))) goto LAB_00149390;
      }
      else {
        bVar4 = worm_known(level,pmVar7);
        if (bVar4 != '\0') {
LAB_00149390:
          uVar2 = *(uint *)&pmVar7->field_0x60;
          if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar2 & 0x280) == 0) goto LAB_001493d0;
          }
          else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001493d0:
            if ((u._1052_1_ & 0x20) == 0) goto LAB_001493da;
          }
        }
      }
    }
    line = "You won\'t hit anything if you can\'t see that spot.";
  }
  else {
LAB_001493da:
    if ((viz_array[local_2a.y][local_2a.x] & 1U) != 0) {
      pmVar3 = level->monsters[local_2a.x][local_2a.y];
      pmVar7 = (monst *)0x0;
      if ((pmVar3 != (monst *)0x0) && ((pmVar3->field_0x61 & 2) == 0)) {
        pmVar7 = pmVar3;
      }
      if (pmVar7 != (monst *)0x0) {
        iVar8 = pmVar7->mhp;
        bhitpos = local_2a;
        check_caitiff(pmVar7);
        thitmonst(pmVar7,uwep,(obj *)0x0);
        if (iVar8 <= pmVar7->mhp) {
          return 1;
        }
        u.uconduct.weaphit = u.uconduct.weaphit + 1;
        return 1;
      }
      pline("Nothing happens.");
      return 1;
    }
    line = "You can\'t reach that spot from here.";
  }
LAB_00149403:
  pline(line);
  return iVar8;
}

Assistant:

static int use_pole (struct obj *obj)
{
	int res = 0, typ, max_range = 4, min_range = 4;
	coord cc;
	struct monst *mtmp;


	/* Are you allowed to use the pole? */
	if (u.uswallow) {
	    pline(not_enough_room);
	    return 0;
	}
	if (obj != uwep) {
	    if (!wield_tool(obj, "swing")) return 0;
	    else res = 1;
	}
     /* assert(obj == uwep); */

	/* Prompt for a location */
	pline(where_to_hit);
	cc.x = u.ux;
	cc.y = u.uy;
	if (getpos(&cc, FALSE, "the spot to hit") < 0)
	    return 0;	/* user pressed ESC */

	/* Calculate range */
	typ = uwep_skill_type();
	if (typ == P_NONE || P_SKILL(typ) <= P_BASIC) max_range = 4;
	else if (P_SKILL(typ) == P_SKILLED) max_range = 5;
	else max_range = 8;
	if (distu(cc.x, cc.y) > max_range) {
	    pline("Too far!");
	    return res;
	} else if (distu(cc.x, cc.y) < min_range) {
	    pline("Too close!");
	    return res;
	} else if (!cansee(cc.x, cc.y) &&
		   ((mtmp = m_at(level, cc.x, cc.y)) == NULL ||
		    !canseemon(level, mtmp))) {
	    pline(cant_see_spot);
	    return res;
	} else if (!couldsee(cc.x, cc.y)) { /* Eyes of the Overworld */
	    pline(cant_reach);
	    return res;
	}

	/* Attack the monster there */
	if ((mtmp = m_at(level, cc.x, cc.y)) != NULL) {
	    int oldhp = mtmp->mhp;

	    bhitpos = cc;
	    check_caitiff(mtmp);
	    thitmonst(mtmp, uwep, NULL);
	    /* check the monster's HP because thitmonst() doesn't return
	     * an indication of whether it hit.  Not perfect (what if it's a
	     * non-silver weapon on a shade?)
	     */
	    if (mtmp->mhp < oldhp)
		u.uconduct.weaphit++;
	} else
	    /* Now you know that nothing is there... */
	    pline("Nothing happens.");
	return 1;
}